

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall cmCTestGlobalVC::cmCTestGlobalVC(cmCTestGlobalVC *this,cmCTest *ct,ostream *log)

{
  ostream *log_local;
  cmCTest *ct_local;
  cmCTestGlobalVC *this_local;
  
  cmCTestVC::cmCTestVC(&this->super_cmCTestVC,ct,log);
  (this->super_cmCTestVC)._vptr_cmCTestVC = (_func_int **)&PTR__cmCTestGlobalVC_016765e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  ::map(&this->Dirs);
  std::__cxx11::string::string((string *)&this->OldRevision);
  std::__cxx11::string::string((string *)&this->NewRevision);
  cmCTestVC::Revision::Revision(&this->PriorRev);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::list
            (&this->Revisions);
  cmCTestVC::Revision::operator=(&this->PriorRev,&(this->super_cmCTestVC).Unknown);
  return;
}

Assistant:

cmCTestGlobalVC::cmCTestGlobalVC(cmCTest* ct, std::ostream& log)
  : cmCTestVC(ct, log)
{
  this->PriorRev = this->Unknown;
}